

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::AddRemapChar(ImFont *this,ImWchar dst,ImWchar src,bool overwrite_dst)

{
  unsigned_short uVar1;
  uint uVar2;
  float fVar3;
  
  if ((this->IndexLookup).Size < 1) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0xb6d,"AddRemapChar","ImGui ASSERT FAILED: %s","IndexLookup.Size > 0");
  }
  uVar2 = (this->IndexLookup).Size;
  if ((uVar2 <= dst) || ((this->IndexLookup).Data[dst] != 0xffff || overwrite_dst)) {
    if (src < uVar2 || dst < uVar2) {
      GrowIndex(this,dst + 1);
      if (src < uVar2) {
        uVar1 = (this->IndexLookup).Data[src];
        if ((this->IndexLookup).Size <= (int)(uint)dst) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        (this->IndexLookup).Data[dst] = uVar1;
        fVar3 = (this->IndexAdvanceX).Data[src];
      }
      else {
        if ((this->IndexLookup).Size <= (int)(uint)dst) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                      ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
        }
        (this->IndexLookup).Data[dst] = 0xffff;
        fVar3 = 1.0;
      }
      if ((this->IndexAdvanceX).Size <= (int)(uint)dst) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      (this->IndexAdvanceX).Data[dst] = fVar3;
    }
  }
  return;
}

Assistant:

void ImFont::AddRemapChar(ImWchar dst, ImWchar src, bool overwrite_dst)
{
    IM_ASSERT(IndexLookup.Size > 0);    // Currently this can only be called AFTER the font has been built, aka after calling ImFontAtlas::GetTexDataAs*() function.
    unsigned int index_size = (unsigned int)IndexLookup.Size;

    if (dst < index_size && IndexLookup.Data[dst] == (ImWchar)-1 && !overwrite_dst) // 'dst' already exists
        return;
    if (src >= index_size && dst >= index_size) // both 'dst' and 'src' don't exist -> no-op
        return;

    GrowIndex(dst + 1);
    IndexLookup[dst] = (src < index_size) ? IndexLookup.Data[src] : (ImWchar)-1;
    IndexAdvanceX[dst] = (src < index_size) ? IndexAdvanceX.Data[src] : 1.0f;
}